

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb_fastpforlib::internal::__fastpack13(uint64_t *in,uint32_t *out)

{
  uint64_t uVar1;
  
  uVar1 = in[2];
  *out = (uint)uVar1 << 0x1a | ((uint)in[1] & 0x1fff) << 0xd | (uint)*in & 0x1fff;
  out[1] = (uint)uVar1 >> 6 & 0x7f;
  Unroller<(unsigned_short)13,_(unsigned_short)3>::Pack(in,out + 1);
  return;
}

Assistant:

void __fastpack13(const uint64_t *__restrict in, uint32_t *__restrict out) {
	Unroller<13>::Pack(in, out);
}